

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O2

int weapon_dam_bonus(obj *weapon)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char cVar4;
  byte bVar5;
  
  iVar2 = weapon_type(weapon);
  if ((u.twoweap == '\0') || ((uwep != weapon && (uswapwep != weapon)))) {
    uVar3 = 0;
    if (iVar2 == 0) {
      iVar2 = 0;
      goto switchD_00271022_caseD_2;
    }
    uVar3 = 0;
    if (iVar2 < 0x1e) {
      cVar1 = u.weapon_skills[iVar2].skill;
      switch(cVar1) {
      case '\x01':
        uVar3 = 0xfffffffe;
        break;
      case '\x02':
        break;
      case '\x03':
        uVar3 = 1;
        break;
      case '\x04':
        uVar3 = 3;
        break;
      default:
        impossible("weapon_dam_bonus: bad skill %d",(ulong)(uint)(int)cVar1);
      case '\0':
        uVar3 = 0xfffffffb;
      }
      goto switchD_00271022_caseD_2;
    }
    if (iVar2 == 0x25) {
      bVar5 = 1;
      if ('\x01' < u.weapon_skills[0x25].skill) {
        bVar5 = u.weapon_skills[0x25].skill;
      }
      iVar2 = 3;
      if (urole.malenum != 0x165) {
        iVar2 = (urole.malenum == 0x160) + 1 + (uint)(urole.malenum == 0x160);
      }
      uVar3 = iVar2 * (uint)bVar5 >> 1;
      iVar2 = 0x25;
      goto switchD_00271022_caseD_2;
    }
    if (iVar2 != 0x26) goto switchD_00271022_caseD_2;
  }
  cVar4 = u.weapon_skills[iVar2].skill;
  cVar1 = u.weapon_skills[0x26].skill;
  if (cVar4 < u.weapon_skills[0x26].skill) {
    cVar1 = cVar4;
  }
  iVar2 = 0x26;
  if ((byte)(cVar1 - 2U) < 3) {
    uVar3 = *(uint *)(&DAT_002c3b00 + (ulong)(byte)(cVar1 - 2U) * 4);
  }
  else {
    uVar3 = 0xfffffffd;
  }
switchD_00271022_caseD_2:
  if ((iVar2 != 0x26) && (u.usteed != (monst *)0x0)) {
    if (u.weapon_skills[0x27].skill == '\x04') {
      uVar3 = uVar3 + 5;
    }
    else if (u.weapon_skills[0x27].skill == '\x03') {
      uVar3 = uVar3 + 2;
    }
  }
  return uVar3;
}

Assistant:

int weapon_dam_bonus(struct obj *weapon)
{
    int type, wep_type, skill, bonus = 0;

    wep_type = weapon_type(weapon);
    /* use two weapon skill only if attacking with one of the wielded weapons */
    type = (u.twoweap && (weapon == uwep || weapon == uswapwep)) ?
	    P_TWO_WEAPON_COMBAT : wep_type;
    if (type == P_NONE) {
	bonus = 0;
    } else if (type <= P_LAST_WEAPON) {
	switch (P_SKILL(type)) {
	    default: impossible("weapon_dam_bonus: bad skill %d",P_SKILL(type));
		     /* fall through */
	    case P_ISRESTRICTED: bonus = -5; break;
	    case P_UNSKILLED:	bonus = -2; break;
	    case P_BASIC:	bonus =  0; break;
	    case P_SKILLED:	bonus =  1; break;
	    case P_EXPERT:	bonus =  3; break;
	}
    } else if (type == P_TWO_WEAPON_COMBAT) {
	skill = P_SKILL(P_TWO_WEAPON_COMBAT);
	if (P_SKILL(wep_type) < skill) skill = P_SKILL(wep_type);
	switch (skill) {
	    default:
	    case P_ISRESTRICTED:
	    case P_UNSKILLED:	bonus = -3; break;
	    case P_BASIC:	bonus = -1; break;
	    case P_SKILLED:	bonus = 0; break;
	    case P_EXPERT:	bonus = 2; break;
	}
    } else if (type == P_BARE_HANDED_COMBAT) {
	/*
	 *	       b.h.  m.a.
	 *	unskl:	 0   n/a
	 *	basic:	+1    +3
	 *	skild:	+1    +4
	 *	exprt:	+2    +6
	 *	mastr:	+2    +7
	 *	grand:	+3    +9
	 */
	bonus = P_SKILL(type);
	bonus = max(bonus,P_UNSKILLED) - 1;	/* unskilled => 0 */
	bonus = ((bonus + 1) * (martial_bonus() ? 3 : 1)) / 2;
    }

	/* KMH -- Riding gives some thrusting damage */
	if (u.usteed && type != P_TWO_WEAPON_COMBAT) {
		switch (P_SKILL(P_RIDING)) {
		    case P_ISRESTRICTED:
		    case P_UNSKILLED:   break;
		    case P_BASIC:       break;
		    case P_SKILLED:     bonus += 2; break;
		    case P_EXPERT:      bonus += 5; break;
		}
	}

    return bonus;
}